

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O2

double __thiscall
imrt::IntensityILS::localSearch
          (IntensityILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  int iVar1;
  int iVar2;
  double intensity;
  double dVar3;
  double dVar4;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  iVar1 = rand();
  iVar2 = *(int *)&(this->super_ILS).field_0x24;
  dVar3 = (double)iVar2;
  intensity = (double)((int)((double)(iVar1 % (int)((this->maxdelta - dVar3) + 1.0) + iVar2) / dVar3
                            ) * iVar2);
  dVar4 = this->maxdelta * this->alpha;
  if (dVar3 <= dVar4) {
    dVar3 = dVar4;
  }
  this->maxdelta = dVar3;
  if (target_beam.first != false) {
    intensity = -intensity;
  }
  dVar3 = this->maxratio;
  iVar2 = 0;
  if (0.5 < dVar3) {
    iVar2 = rand();
    dVar3 = this->maxratio;
    iVar2 = iVar2 % (int)(dVar3 + 0.5);
  }
  this->maxratio = dVar3 * this->beta;
  Station::increaseIntensity_repair_abi_cxx11_
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_40,
             target_beam.second.first,target_beam.second.second,intensity,iVar2);
  dVar3 = Plan::incremental_eval
                    (P,target_beam.second.first,
                     (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_40);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&local_40);
  return dVar3;
}

Assistant:

double IntensityILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P){
		Station*s = target_beam.second.first; int beamlet=target_beam.second.second;
		bool sign=target_beam.first; //impact in F (+ or -)

		//double delta_intensity= rand()%3+1;

		double delta_intensity= rand()%int(maxdelta-step_intensity+1)+step_intensity; //random entre step_intensity y maxdelta
		delta_intensity = (int)  (delta_intensity/step_intensity) * step_intensity;

		maxdelta = maxdelta*alpha;
		if(maxdelta < step_intensity) maxdelta=step_intensity;

		if(sign) delta_intensity*=-1;

		double ratio= (maxratio>0.5)? rand()%int(maxratio + 0.5) : 0;
		maxratio = maxratio*beta;

		auto diff=s->increaseIntensity_repair(beamlet,delta_intensity,ratio);
		double eval=P.incremental_eval(*s,diff);
		//F.incremental_eval(*s,w,Zmin,Zmax, diff);

		return eval;
	}